

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct.pb.cc
# Opt level: O2

void __thiscall google::protobuf::Struct::Clear(Struct *this)

{
  internal::MapFieldBase::Clear((MapFieldBase *)&(this->field_0)._impl_);
  internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void Struct::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.Struct)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.fields_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}